

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall TypeFactory::clear(TypeFactory *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->tree)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 0x10))();
    }
  }
  std::
  _Rb_tree<Datatype_*,_Datatype_*,_std::_Identity<Datatype_*>,_DatatypeCompare,_std::allocator<Datatype_*>_>
  ::clear(&(this->tree)._M_t);
  std::
  _Rb_tree<Datatype_*,_Datatype_*,_std::_Identity<Datatype_*>,_DatatypeNameCompare,_std::allocator<Datatype_*>_>
  ::clear(&(this->nametree)._M_t);
  clearCache(this);
  return;
}

Assistant:

void TypeFactory::clear(void)

{
  DatatypeSet::iterator iter;

  for(iter=tree.begin();iter!=tree.end();++iter)
    delete *iter;
  tree.clear();
  nametree.clear();
  clearCache();
}